

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

void __thiscall
QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
          (QPDFEmbeddedFileDocumentHelper *this,string *name,QPDFFileSpecObjectHelper *fs)

{
  QPDFFileSpecObjectHelper *key;
  __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  undefined1 local_78 [88];
  QPDFFileSpecObjectHelper *local_20;
  QPDFFileSpecObjectHelper *fs_local;
  string *name_local;
  QPDFEmbeddedFileDocumentHelper *this_local;
  
  local_20 = fs;
  fs_local = (QPDFFileSpecObjectHelper *)name;
  name_local = (string *)this;
  initEmbeddedFiles(this);
  this_00 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m);
  this_01 = std::
            __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_00);
  key = fs_local;
  QPDFObjectHelper::getObjectHandle((QPDFObjectHelper *)local_78);
  QPDFNameTreeObjectHelper::insert
            ((iterator *)(local_78 + 0x10),this_01,(string *)key,(QPDFObjectHandle *)local_78);
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)(local_78 + 0x10));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_78);
  return;
}

Assistant:

void
QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile(
    std::string const& name, QPDFFileSpecObjectHelper const& fs)
{
    initEmbeddedFiles();
    m->embedded_files->insert(name, fs.getObjectHandle());
}